

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,char *table)

{
  undefined1 auStack_20 [8];
  Name name;
  
  wasm::Name::Name((Name *)auStack_20,table);
  if (expr->_id == CallIndirectId) {
    expr[4]._id = auStack_20;
    expr[4].type.id = name.super_IString.str._M_len;
    return;
  }
  __assert_fail("expression->is<CallIndirect>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x90b,"void BinaryenCallIndirectSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,
                                  const char* table) {
  Name name(table);
  auto* expression = (Expression*)expr;

  assert(expression->is<CallIndirect>());
  static_cast<CallIndirect*>(expression)->table = name;
}